

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::ContainsType
          (ValidationState_t *this,uint32_t id,
          function<bool_(const_spvtools::val::Instruction_*)> *f,bool traverse_all_types)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  uint id_00;
  Instruction *__args;
  ulong uVar4;
  ulong uVar5;
  
LAB_001d4a2e:
  do {
    __args = FindDef(this,id);
    if (__args == (Instruction *)0x0) {
      return false;
    }
    bVar2 = std::function<bool_(const_spvtools::val::Instruction_*)>::operator()(f,__args);
    if (bVar2) {
      return true;
    }
    uVar1 = (__args->inst_).opcode;
    uVar4 = (ulong)uVar1;
    if (uVar4 < 0x22) {
      if ((0x3b800000UL >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x240000000U >> (uVar4 & 0x3f) & 1) != 0) {
          if ((~traverse_all_types & uVar1 == 0x21) != 0) {
            return false;
          }
          uVar4 = 1;
          do {
            uVar5 = (long)(__args->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(__args->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            bVar2 = uVar4 < uVar5;
            if (uVar5 <= uVar4) {
              return bVar2;
            }
            id_00 = Instruction::GetOperandAs<unsigned_int>(__args,uVar4);
            bVar3 = ContainsType(this,id_00,f,(bool)(traverse_all_types & 1));
            uVar4 = (ulong)((int)uVar4 + 1);
          } while (!bVar3);
          return bVar2;
        }
        if (uVar4 != 0x20) goto LAB_001d4ac3;
        bVar2 = IsForwardPointer(this,id);
        if (bVar2) {
          return false;
        }
        if (((traverse_all_types ^ 1U) & 1) != 0) {
          return false;
        }
        id = Instruction::GetOperandAs<unsigned_int>(__args,2);
        traverse_all_types = true;
        goto LAB_001d4a2e;
      }
    }
    else {
LAB_001d4ac3:
      if ((uVar1 != 0x14ee) && (uVar1 != 0x1168)) {
        return false;
      }
    }
    id = Instruction::GetOperandAs<unsigned_int>(__args,1);
  } while( true );
}

Assistant:

bool ValidationState_t::ContainsType(
    uint32_t id, const std::function<bool(const Instruction*)>& f,
    bool traverse_all_types) const {
  const auto inst = FindDef(id);
  if (!inst) return false;

  if (f(inst)) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return ContainsType(inst->GetOperandAs<uint32_t>(1u), f,
                          traverse_all_types);
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      if (traverse_all_types) {
        return ContainsType(inst->GetOperandAs<uint32_t>(2u), f,
                            traverse_all_types);
      }
      break;
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct:
      if (inst->opcode() == spv::Op::OpTypeFunction && !traverse_all_types) {
        return false;
      }
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsType(inst->GetOperandAs<uint32_t>(i), f,
                         traverse_all_types)) {
          return true;
        }
      }
      break;
    default:
      break;
  }

  return false;
}